

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

bool __thiscall QWidgetPrivate::handleClose(QWidgetPrivate *this,CloseMode mode)

{
  bool bVar1;
  QWidget *this_00;
  QDebug *o;
  int in_ESI;
  QWidgetPrivate *in_RDI;
  long in_FS_OFFSET;
  QWidget *q;
  QCloseEvent e;
  QPointer<QWidget> that;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  undefined7 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5f;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  int iVar2;
  undefined4 in_stack_ffffffffffffff78;
  byte local_71;
  undefined1 *local_70;
  undefined1 *local_68;
  undefined1 *local_60;
  char *in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffc3;
  WidgetAttribute in_stack_ffffffffffffffc4;
  QWidget *in_stack_ffffffffffffffc8;
  QDebug local_30;
  QDebug in_stack_ffffffffffffffd8;
  QDebug in_stack_ffffffffffffffe0;
  undefined1 *local_18;
  undefined1 local_10;
  undefined7 uStack_f;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = q_func(in_RDI);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = 0xaa;
  uStack_f = 0xaaaaaaaaaaaaaa;
  QtPrivateLogging::lcWidgetShowHide();
  anon_unknown.dwarf_2490c2::QLoggingCategoryMacroHolder<(QtMsgType)0>::QLoggingCategoryMacroHolder
            ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)in_RDI,
             (QLoggingCategory *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
  while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                           ((QLoggingCategoryMacroHolder *)&local_18), bVar1) {
    anon_unknown.dwarf_2490c2::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
              ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x37aa2f);
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)this_00,
               (char *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
               (int)((ulong)in_RDI >> 0x20),
               (char *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58),
               (char *)0x37aa45);
    QMessageLogger::debug();
    o = QDebug::operator<<((QDebug *)CONCAT44(in_ESI,in_stack_ffffffffffffff78),
                           in_stack_ffffffffffffffa8);
    QDebug::QDebug((QDebug *)&stack0xffffffffffffffd8,o);
    ::operator<<((QDebug *)in_stack_ffffffffffffffe0.stream,
                 (QWidget *)in_stack_ffffffffffffffd8.stream);
    QDebug::~QDebug((QDebug *)&stack0xffffffffffffffe0);
    QDebug::~QDebug((QDebug *)&stack0xffffffffffffffd8);
    QDebug::~QDebug(&local_30);
    local_10 = 0;
  }
  if ((*(uint *)&(in_RDI->data).field_0x10 >> 9 & 1) != 0) {
    local_71 = 1;
    goto LAB_0037ac94;
  }
  *(uint *)&(in_RDI->data).field_0x10 = *(uint *)&(in_RDI->data).field_0x10 & 0xfffffdff | 0x200;
  local_60 = &DAT_aaaaaaaaaaaaaaaa;
  QPointer<QWidget>::QPointer<void>
            ((QPointer<QWidget> *)in_RDI,
             (QWidget *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
  if ((*(uint *)&(in_RDI->data).field_0x10 >> 0x12 & 1) != 0) {
    in_ESI = 0;
  }
  if (in_ESI == 0) {
LAB_0037abfd:
    bVar1 = QPointer<QWidget>::isNull((QPointer<QWidget> *)0x37ac07);
    if ((!bVar1) && (bVar1 = QWidget::isHidden((QWidget *)0x37ac15), !bVar1)) {
      QWidget::hide((QWidget *)0x37ac23);
    }
    bVar1 = QPointer<QWidget>::isNull((QPointer<QWidget> *)0x37ac2d);
    if (!bVar1) {
      *(uint *)&(in_RDI->data).field_0x10 = *(uint *)&(in_RDI->data).field_0x10 & 0xfffffdff;
      bVar1 = QWidget::testAttribute
                        ((QWidget *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                         (WidgetAttribute)((ulong)in_RDI >> 0x20));
      if (bVar1) {
        QWidget::setAttribute
                  (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4,
                   (bool)in_stack_ffffffffffffffc3);
        QObject::deleteLater();
      }
    }
    local_71 = 1;
  }
  else {
    local_70 = &DAT_aaaaaaaaaaaaaaaa;
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    QCloseEvent::QCloseEvent((QCloseEvent *)&local_70);
    if (in_ESI == 2) {
      QCoreApplication::sendSpontaneousEvent(&this_00->super_QObject,(QEvent *)&local_70);
    }
    else {
      QCoreApplication::sendEvent(&this_00->super_QObject,(QEvent *)&local_70);
    }
    bVar1 = QPointer<QWidget>::isNull((QPointer<QWidget> *)0x37aba0);
    if ((bVar1) || (bVar1 = QEvent::isAccepted((QEvent *)&local_70), bVar1)) {
      iVar2 = 0;
    }
    else {
      *(uint *)&(in_RDI->data).field_0x10 = *(uint *)&(in_RDI->data).field_0x10 & 0xfffffdff;
      local_71 = 0;
      iVar2 = 1;
    }
    QCloseEvent::~QCloseEvent((QCloseEvent *)&local_70);
    if (iVar2 == 0) {
      in_stack_ffffffffffffff6c = 0;
      goto LAB_0037abfd;
    }
  }
  QPointer<QWidget>::~QPointer((QPointer<QWidget> *)0x37ac94);
LAB_0037ac94:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (bool)(local_71 & 1);
}

Assistant:

bool QWidgetPrivate::handleClose(CloseMode mode)
{
    Q_Q(QWidget);
    qCDebug(lcWidgetShowHide) << "Handling close event for" << q;

    if (data.is_closing)
        return true;

    // We might not have initiated the close, so update the state now that we know
    data.is_closing = true;

    QPointer<QWidget> that = q;

    if (data.in_destructor)
        mode = CloseNoEvent;

    if (mode != CloseNoEvent) {
        QCloseEvent e;
        if (mode == CloseWithSpontaneousEvent)
            QApplication::sendSpontaneousEvent(q, &e);
        else
            QCoreApplication::sendEvent(q, &e);
        if (!that.isNull() && !e.isAccepted()) {
            data.is_closing = false;
            return false;
        }
    }

    // even for windows, make sure we deliver a hide event and that all children get hidden
    if (!that.isNull() && !q->isHidden())
        q->hide();

    if (!that.isNull()) {
        data.is_closing = false;
        if (q->testAttribute(Qt::WA_DeleteOnClose)) {
            q->setAttribute(Qt::WA_DeleteOnClose, false);
            q->deleteLater();
        }
    }
    return true;
}